

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThreeAction.cpp
# Opt level: O1

ActionResults * __thiscall GreenRoomThreeAction::Look(GreenRoomThreeAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BASIN) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"The basin looks clean. You feel you can clean anything here.",""
              );
    ActionResults::ActionResults(pAVar2,CURRENT,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return pAVar2;
  }
  pAVar2 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
  return pAVar2;
}

Assistant:

ActionResults * GreenRoomThreeAction::Look() {
    if(commands->getMainItem() == BASIN) {
        return new ActionResults(CURRENT, "The basin looks clean. You feel you can clean anything here.");
    } else {
        return AbstractRoomAction::Look();
    }

}